

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.h
# Opt level: O0

void __thiscall RtMidiError::printMessage(RtMidiError *this)

{
  ostream *poVar1;
  RtMidiError *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,'\n');
  poVar1 = std::operator<<(poVar1,(string *)&this->message_);
  std::operator<<(poVar1,"\n\n");
  return;
}

Assistant:

virtual void printMessage( void ) const throw() { std::cerr << '\n' << message_ << "\n\n"; }